

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-init.c
# Opt level: O0

parser_error parse_ghost_freq(parser *p)

{
  uint uVar1;
  wchar_t wVar2;
  void *pvVar3;
  wchar_t exists;
  ghost *g;
  parser *p_local;
  
  pvVar3 = parser_priv(p);
  if (pvVar3 != (void *)0x0) {
    uVar1 = parser_getuint(p,"exists");
    if (uVar1 == 0) {
      wVar2 = parser_getint(p,"add");
      *(wchar_t *)((long)pvVar3 + 0x10) = wVar2;
    }
    else {
      wVar2 = parser_getint(p,"add");
      *(wchar_t *)((long)pvVar3 + 0x14) = wVar2;
    }
    return PARSE_ERROR_NONE;
  }
  __assert_fail("g",
                "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/mon-init.c"
                ,0x79f,"enum parser_error parse_ghost_freq(struct parser *)");
}

Assistant:

static enum parser_error parse_ghost_freq(struct parser *p) {
	struct ghost *g = parser_priv(p);
	int exists;
	assert(g);

	exists = parser_getuint(p, "exists");
	if (exists) {
		g->freq_if_positive = parser_getint(p, "add");
	} else {
		g->freq_if_zero = parser_getint(p, "add");
	}
	return PARSE_ERROR_NONE;
}